

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

String * __thiscall Tigre::String::aleatorio(String *__return_storage_ptr__,String *this,int len)

{
  long lVar1;
  String *this_00;
  int iVar2;
  ulong uVar3;
  char *s;
  undefined8 uStack_40;
  String *local_38;
  
  lVar1 = -((ulong)(len + 1) + 0xf & 0xfffffffffffffff0);
  s = (char *)((long)&local_38 + lVar1);
  local_38 = __return_storage_ptr__;
  if (0 < len) {
    uVar3 = 0;
    do {
      *(undefined8 *)((long)&uStack_40 + lVar1) = 0x1032ba;
      iVar2 = rand();
      s[uVar3] = (&DAT_00104070)[iVar2 % 0x40];
      uVar3 = uVar3 + 1;
    } while ((uint)len != uVar3);
  }
  s[len] = '\0';
  this_00 = local_38;
  *(undefined8 *)((long)&uStack_40 + lVar1) = 0x1032ef;
  String(this_00,s);
  return this_00;
}

Assistant:

Tigre::String Tigre::String::aleatorio(int len) {
    char alfabeto[] = {
            '0', '1', '2', '3', '4', '5', '6', '7',
            '8', '9', 'A', 'B', 'C', 'D', 'E', 'F',
            'G', 'H', 'I', 'J', 'K', 'L', 'M', 'N',
            'O', 'P', 'Q', 'R', 'S', 'T', 'U', 'V',
            'W', 'X', 'Y', 'X', 'a', 'b', 'c', 'd',
            'e', 'f', 'g', 'h', 'i', 'j', 'k', 'l',
            'm', 'n', 'o', 'p', 'q', 'r', 's', 't',
            'u', 'v', 'w', 'x', 'y', 'z', '*', '#'
    };

    char palavra[len+1];

    for (int i = 0; i < len; i++) {
        palavra[i] = alfabeto[ rand() % 64 ]; /* 62 é o tamanho do alfabeto */
    }

    palavra[len] = '\0';

    return palavra;
}